

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void col_txfm_8x8_rounding(__m256i *in,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  uint in_ESI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m256i rounding;
  char local_494;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_494 = (char)in_ESI;
  uVar9 = 1 << (local_494 - 1U & 0x1f);
  auVar11 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar11 = vpinsrd_avx(auVar11,uVar9,2);
  auVar11 = vpinsrd_avx(auVar11,uVar9,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar10 = vpinsrd_avx(auVar10,uVar9,2);
  auVar10 = vpinsrd_avx(auVar10,uVar9,3);
  auVar10 = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar10;
  auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  uStack_70 = auVar11._0_8_;
  uStack_68 = auVar11._8_8_;
  auVar8._16_8_ = uStack_70;
  auVar8._0_16_ = auVar10;
  auVar8._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(*in_RDI,auVar8);
  *in_RDI = auVar1;
  auVar7._16_8_ = uStack_70;
  auVar7._0_16_ = auVar10;
  auVar7._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[1],auVar7);
  in_RDI[1] = auVar1;
  auVar6._16_8_ = uStack_70;
  auVar6._0_16_ = auVar10;
  auVar6._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[2],auVar6);
  in_RDI[2] = auVar1;
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = auVar10;
  auVar5._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[3],auVar5);
  in_RDI[3] = auVar1;
  auVar4._16_8_ = uStack_70;
  auVar4._0_16_ = auVar10;
  auVar4._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[4],auVar4);
  in_RDI[4] = auVar1;
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = auVar10;
  auVar3._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[5],auVar3);
  in_RDI[5] = auVar1;
  auVar2._16_8_ = uStack_70;
  auVar2._0_16_ = auVar10;
  auVar2._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[6],auVar2);
  in_RDI[6] = auVar1;
  auVar1._16_8_ = uStack_70;
  auVar1._0_16_ = auVar10;
  auVar1._24_8_ = uStack_68;
  auVar1 = vpaddd_avx2(in_RDI[7],auVar1);
  in_RDI[7] = auVar1;
  auVar1 = vpsrad_avx2(*in_RDI,ZEXT416(in_ESI));
  *in_RDI = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[1],ZEXT416(in_ESI));
  in_RDI[1] = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[2],ZEXT416(in_ESI));
  in_RDI[2] = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[3],ZEXT416(in_ESI));
  in_RDI[3] = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[4],ZEXT416(in_ESI));
  in_RDI[4] = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[5],ZEXT416(in_ESI));
  in_RDI[5] = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[6],ZEXT416(in_ESI));
  in_RDI[6] = auVar1;
  auVar1 = vpsrad_avx2(in_RDI[7],ZEXT416(in_ESI));
  in_RDI[7] = auVar1;
  return;
}

Assistant:

static inline void col_txfm_8x8_rounding(__m256i *in, int shift) {
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));

  in[0] = _mm256_add_epi32(in[0], rounding);
  in[1] = _mm256_add_epi32(in[1], rounding);
  in[2] = _mm256_add_epi32(in[2], rounding);
  in[3] = _mm256_add_epi32(in[3], rounding);
  in[4] = _mm256_add_epi32(in[4], rounding);
  in[5] = _mm256_add_epi32(in[5], rounding);
  in[6] = _mm256_add_epi32(in[6], rounding);
  in[7] = _mm256_add_epi32(in[7], rounding);

  in[0] = _mm256_srai_epi32(in[0], shift);
  in[1] = _mm256_srai_epi32(in[1], shift);
  in[2] = _mm256_srai_epi32(in[2], shift);
  in[3] = _mm256_srai_epi32(in[3], shift);
  in[4] = _mm256_srai_epi32(in[4], shift);
  in[5] = _mm256_srai_epi32(in[5], shift);
  in[6] = _mm256_srai_epi32(in[6], shift);
  in[7] = _mm256_srai_epi32(in[7], shift);
}